

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdNode.cpp
# Opt level: O2

KdNode * KdNode::build(vector<Triangle,_std::allocator<Triangle>_> *triangles,
                      vector<float,_std::allocator<float>_> *ranges,int depth)

{
  pointer pTVar1;
  pointer pfVar2;
  int iVar3;
  int iVar4;
  KdNode *pKVar5;
  KdNode *pKVar6;
  iterator __end1;
  iterator __begin1;
  pointer pTVar7;
  float fVar8;
  float fVar9;
  Point PVar10;
  undefined1 auStack_98 [8];
  vector<Triangle,_std::allocator<Triangle>_> leftTrs;
  undefined1 auStack_78 [8];
  vector<Triangle,_std::allocator<Triangle>_> rightTrs;
  
  pTVar7 = (triangles->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (triangles->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar1 == pTVar7) {
    pKVar5 = (KdNode *)0x0;
  }
  else {
    pKVar5 = (KdNode *)operator_new(0x30);
    *(undefined8 *)pKVar5 = 0;
    pKVar5->left = (KdNode *)0x0;
    pKVar5->right = (KdNode *)0x0;
    (pKVar5->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pKVar5->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pKVar5->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (depth < 0x15 && 0x27f < (ulong)((long)pTVar1 - (long)pTVar7)) {
      auStack_98 = (undefined1  [8])0x0;
      leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_78 = (undefined1  [8])0x0;
      rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      iVar3 = depth % 3;
      iVar4 = iVar3 * 2;
      pfVar2 = (ranges->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)(long)(iVar3 * 2 + 1);
      fVar8 = (pfVar2[iVar4] +
              pfVar2[(long)rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage]) * 0.5;
      for (; pTVar7 != pTVar1; pTVar7 = pTVar7 + 1) {
        if (iVar3 == 2) {
          PVar10 = getMinPoint(pTVar7);
          if (PVar10.z <= fVar8) {
            std::vector<Triangle,_std::allocator<Triangle>_>::push_back
                      ((vector<Triangle,_std::allocator<Triangle>_> *)auStack_98,pTVar7);
          }
          PVar10 = getMaxPoint(pTVar7);
          fVar9 = PVar10.z;
joined_r0x001066ff:
          if (fVar8 < fVar9) {
            std::vector<Triangle,_std::allocator<Triangle>_>::push_back
                      ((vector<Triangle,_std::allocator<Triangle>_> *)auStack_78,pTVar7);
          }
        }
        else {
          if (iVar3 == 1) {
            PVar10 = getMinPoint(pTVar7);
            if (PVar10.y <= fVar8) {
              std::vector<Triangle,_std::allocator<Triangle>_>::push_back
                        ((vector<Triangle,_std::allocator<Triangle>_> *)auStack_98,pTVar7);
            }
            PVar10 = getMaxPoint(pTVar7);
            fVar9 = PVar10.y;
            goto joined_r0x001066ff;
          }
          if (iVar3 == 0) {
            PVar10 = getMinPoint(pTVar7);
            if (PVar10.x <= fVar8) {
              std::vector<Triangle,_std::allocator<Triangle>_>::push_back
                        ((vector<Triangle,_std::allocator<Triangle>_> *)auStack_98,pTVar7);
            }
            PVar10 = getMaxPoint(pTVar7);
            fVar9 = PVar10.x;
            goto joined_r0x001066ff;
          }
        }
      }
      pKVar5->plane = fVar8;
      pfVar2 = (ranges->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      fVar9 = pfVar2[iVar4];
      pfVar2[iVar4] = fVar8;
      pKVar6 = build((vector<Triangle,_std::allocator<Triangle>_> *)auStack_78,ranges,depth + 1);
      pTVar7 = rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pKVar5->right = pKVar6;
      pfVar2 = (ranges->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar2[iVar4] = fVar9;
      fVar9 = pfVar2[(long)rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage];
      pfVar2[(long)rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage] = fVar8;
      pKVar6 = build((vector<Triangle,_std::allocator<Triangle>_> *)auStack_98,ranges,depth + 1);
      pKVar5->left = pKVar6;
      (ranges->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start[(long)pTVar7] = fVar9;
      std::_Vector_base<Triangle,_std::allocator<Triangle>_>::~_Vector_base
                ((_Vector_base<Triangle,_std::allocator<Triangle>_> *)auStack_78);
      std::_Vector_base<Triangle,_std::allocator<Triangle>_>::~_Vector_base
                ((_Vector_base<Triangle,_std::allocator<Triangle>_> *)auStack_98);
    }
    else {
      std::vector<Triangle,_std::allocator<Triangle>_>::operator=(&pKVar5->triangles,triangles);
    }
  }
  return pKVar5;
}

Assistant:

KdNode* KdNode::build(std::vector<Triangle>& triangles, std::vector<float> &ranges, int depth)
{
  if (triangles.size() == 0)
    return nullptr;

  KdNode* node = new KdNode();

  if (triangles.size() < 10 || depth > 20)
  {
    node->triangles = triangles;
    return node;
  }

  std::vector<Triangle> leftTrs;
  std::vector<Triangle> rightTrs;

  int axis = depth % 3;

  float midValue = (ranges[axis*2] + ranges[axis*2+1]) / 2;
  for (auto const& triangle : triangles)
  {
    switch (axis)
    {
      case 0:
        if(getMinPoint(triangle).x <= midValue)
            leftTrs.push_back(triangle);
        if(getMaxPoint(triangle).x > midValue)
            rightTrs.push_back(triangle);
        break;
      case 1:
        if(getMinPoint(triangle).y <= midValue)
            leftTrs.push_back(triangle);
        if(getMaxPoint(triangle).y > midValue)
            rightTrs.push_back(triangle);
        break;
      case 2:
        if(getMinPoint(triangle).z <= midValue)
            leftTrs.push_back(triangle);
        if(getMaxPoint(triangle).z > midValue)
            rightTrs.push_back(triangle);
        break;
    }
  }

  node->plane = midValue;

  float tmp = ranges[axis*2];
  ranges[axis*2] = midValue;
  node->right = KdNode::build(rightTrs, ranges, depth+1);
  ranges[axis*2] = tmp;
  tmp = ranges[axis*2+1];
  ranges[axis*2+1] = midValue;
  node->left = KdNode::build(leftTrs, ranges, depth+1);
  ranges[axis*2+1] = tmp;

  return node;
}